

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# token.hpp
# Opt level: O0

bool pfederc::isNumberType(TokenType type)

{
  TokenType type_local;
  
  return (ushort)(type - TOK_INT8) < 10;
}

Assistant:

inline bool isNumberType(TokenType type) noexcept {
    switch(type) {
    case TokenType::TOK_INT8:
    case TokenType::TOK_INT16:
    case TokenType::TOK_INT32:
    case TokenType::TOK_INT64:
    case TokenType::TOK_UINT8:
    case TokenType::TOK_UINT16:
    case TokenType::TOK_UINT32:
    case TokenType::TOK_UINT64:
    case TokenType::TOK_FLT32:
    case TokenType::TOK_FLT64:
      return true;
    default:
      return false;
    }
  }